

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O1

Vec3fa __thiscall
embree::avx512::LineSegmentsISA::computeDirection(LineSegmentsISA *this,uint primID,size_t time)

{
  uint uVar1;
  long lVar2;
  RefCount RVar3;
  long in_RCX;
  undefined4 in_register_00000034;
  long lVar4;
  undefined8 in_XMM1_Qa;
  Vec3fa VVar5;
  
  lVar4 = CONCAT44(in_register_00000034,primID);
  uVar1 = *(uint *)(*(long *)(lVar4 + 0x58) + (time & 0xffffffff) * *(long *)(lVar4 + 0x68));
  lVar2 = *(long *)(*(long *)(lVar4 + 0x150) + in_RCX * 0x38);
  lVar4 = *(long *)(*(long *)(lVar4 + 0x150) + 0x10 + in_RCX * 0x38);
  RVar3 = (RefCount)
          vsubps_avx(*(undefined1 (*) [16])(lVar2 + (ulong)(uVar1 + 1) * lVar4),
                     *(undefined1 (*) [16])(lVar2 + (ulong)uVar1 * lVar4));
  (this->super_LineSegments).super_Geometry.super_RefCount = RVar3;
  VVar5.field_0._0_8_ = RVar3._vptr_RefCount;
  VVar5.field_0._8_8_ = in_XMM1_Qa;
  return (Vec3fa)VVar5.field_0;
}

Assistant:

Vec3fa computeDirection(unsigned int primID, size_t time) const
      {
        const unsigned vtxID = segment(primID);
        const Vec3fa v0 = vertex(vtxID+0,time);
        const Vec3fa v1 = vertex(vtxID+1,time);
        return v1-v0;
      }